

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

ProductData * OpticsParser::parseBSDFXMLString(ProductData *__return_storage_ptr__,string *contents)

{
  runtime_error *this;
  stringstream msg;
  optional<BSDFData::WindowElement> el;
  string local_6b0 [32];
  stringstream local_690 [16];
  ostream local_680 [376];
  _Optional_payload_base<BSDFData::WindowElement> local_508;
  
  BSDFData::loadWindowElementFromString((optional<BSDFData::WindowElement> *)&local_508,contents);
  if (local_508._M_engaged == true) {
    convert(__return_storage_ptr__,(WindowElement *)&local_508);
    if (local_508._M_engaged == true) {
      std::_Optional_payload_base<BSDFData::WindowElement>::_M_destroy(&local_508);
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream(local_690);
  std::__ostream_insert<char,std::char_traits<char>>(local_680,"Cannot parse BSDFXML string: ",0x1d)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            (local_680,(contents->_M_dataplus)._M_p,contents->_M_string_length);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_6b0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ProductData parseBSDFXMLString(std::string const & contents)
    {
        auto el = BSDFData::loadWindowElementFromString(contents);
        if(el.has_value())
        {
            return convert(*el);
        }

        // Tests are designed to throw exceptions if the file is not found.
        // This will allow tests to pass.
        std::stringstream msg;
        msg << "Cannot parse BSDFXML string: " << contents;
        throw std::runtime_error(msg.str());
    }